

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

int __thiscall QMetaObjectBuilder::indexOfEnumerator(QMetaObjectBuilder *this,QByteArray *name)

{
  pointer pQVar1;
  bool bVar2;
  pointer pQVar3;
  long lVar4;
  
  pQVar3 = (this->d->enumerators).
           super__Vector_base<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pQVar1 = (this->d->enumerators).
           super__Vector_base<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pQVar3 != pQVar1) {
    lVar4 = -(long)pQVar3;
    do {
      bVar2 = ::operator==(name,&pQVar3->name);
      if (bVar2) {
        pQVar3 = (this->d->enumerators).
                 super__Vector_base<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pQVar3 != (this->d->enumerators).
                      super__Vector_base<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          return (int)((ulong)-((long)&(pQVar3->name).d.d + lVar4) >> 4) * -0x49249249;
        }
        indexOfEnumerator();
      }
      pQVar3 = pQVar3 + 1;
      lVar4 = lVar4 + -0x70;
    } while (pQVar3 != pQVar1);
  }
  return -1;
}

Assistant:

int QMetaObjectBuilder::indexOfEnumerator(const QByteArray &name)
{
    for (const auto &enumerator : d->enumerators) {
        if (name == enumerator.name)
            return int(&enumerator - &d->enumerators.front());
    }
    return -1;
}